

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_util_test.c
# Opt level: O2

_Bool test_uo_temp_strcat(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = uo_temp_strcat("lorem ip","sum");
  iVar1 = strcmp("lorem ipsum",pcVar3);
  pcVar3 = uo_temp_strcat("lorem ip","sum");
  uo_temp_strcat(pcVar3," asdf");
  iVar2 = strcmp("lorem ipsum asdf",pcVar3);
  return iVar2 == 0 && iVar1 == 0;
}

Assistant:

bool test_uo_temp_strcat(void)
{
    bool passed = true;

    passed &= strcmp("lorem ipsum", uo_temp_strcat("lorem ip", "sum")) == 0;

    char *temp = uo_temp_strcat("lorem ip", "sum");
    uo_temp_strcat(temp, " asdf");
    passed &= strcmp("lorem ipsum asdf", temp) == 0;

    return passed;
}